

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

string * __thiscall
(anonymous_namespace)::gtest_AllECCurveTest_EvalGenerateName__abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TestParamInfo<int> *info)

{
  bool bVar1;
  TestParamInfo<int> *extraout_RDX;
  TestParamInfo<int> *extraout_RDX_00;
  TestParamInfo<int> *params;
  tuple<testing::internal::ParamGenerator<int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_testing::TestParamInfo<int>_&)>
  t;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_58;
  _Vector_base<int,_std::allocator<int>_> local_48;
  code *local_30;
  __shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
  local_28;
  
  bVar1 = testing::internal::AlwaysFalse();
  params = extraout_RDX;
  if (bVar1) {
    anon_unknown.dwarf_4495f9::AllCurves();
    testing::ValuesIn<std::vector<int,std::allocator<int>>>
              ((testing *)&_Stack_58,(vector<int,_std::allocator<int>_> *)&local_48);
    local_30 = CurveToString_abi_cxx11_;
    std::
    __shared_ptr<const_testing::internal::ParamGeneratorInterface<int>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_28,&_Stack_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_58._M_refcount);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    params = extraout_RDX_00;
  }
  CurveToString_abi_cxx11_(__return_storage_ptr__,this,params);
  return __return_storage_ptr__;
}

Assistant:

static const EC_GROUP *GetCurve(FileTest *t, const char *key) {
  std::string curve_name;
  if (!t->GetAttribute(&curve_name, key)) {
    return nullptr;
  }

  if (curve_name == "P-224") {
    return EC_group_p224();
  }
  if (curve_name == "P-256") {
    return EC_group_p256();
  }
  if (curve_name == "P-384") {
    return EC_group_p384();
  }
  if (curve_name == "P-521") {
    return EC_group_p521();
  }

  t->PrintLine("Unknown curve '%s'", curve_name.c_str());
  return nullptr;
}